

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging_unittest.cc
# Opt level: O2

void PrefixAttacher(ostream *s,LogMessageInfo *l,void *data)

{
  bool bVar1;
  ostream *poVar2;
  long *plVar3;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  
  if (data != (void *)0x0) {
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            data,"good data");
    if (!bVar1) {
      poVar2 = std::operator<<(s,*l->severity);
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 4;
      plVar3 = (long *)std::ostream::operator<<(poVar2,(l->time->tm_).tm_year + 0x76c);
      *(undefined8 *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x10) = 2;
      plVar3 = (long *)std::ostream::operator<<(plVar3,(l->time->tm_).tm_mon + 1);
      *(undefined8 *)((long)plVar3 + *(long *)(*plVar3 + -0x18) + 0x10) = 2;
      poVar2 = (ostream *)std::ostream::operator<<(plVar3,(l->time->tm_).tm_mday);
      poVar2 = std::operator<<(poVar2,' ');
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(l->time->tm_).tm_hour);
      poVar2 = std::operator<<(poVar2,':');
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(l->time->tm_).tm_min);
      poVar2 = std::operator<<(poVar2,':');
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 2;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,(l->time->tm_).tm_sec);
      poVar2 = std::operator<<(poVar2,".");
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 6;
      poVar2 = std::ostream::_M_insert<long>((long)poVar2);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::operator<<(poVar2,0x20);
      *(undefined8 *)(&poVar2->field_0x10 + (long)poVar2->_vptr_basic_ostream[-3]) = 5;
      pbVar4 = std::operator<<(poVar2,(id)(l->thread_id)._M_thread);
      poVar2 = std::operator<<(pbVar4,0x30);
      poVar2 = std::operator<<(poVar2,' ');
      poVar2 = std::operator<<(poVar2,l->filename);
      poVar2 = std::operator<<(poVar2,':');
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,*l->line_number);
      std::operator<<(poVar2,"]");
      return;
    }
  }
  return;
}

Assistant:

void PrefixAttacher(std::ostream& s, const LogMessageInfo& l, void* data) {
  // Assert that `data` contains the expected contents before producing the
  // prefix (otherwise causing the tests to fail):
  if (data == nullptr || *static_cast<string*>(data) != "good data") {
    return;
  }

  s << l.severity[0] << setw(4) << 1900 + l.time.year() << setw(2)
    << 1 + l.time.month() << setw(2) << l.time.day() << ' ' << setw(2)
    << l.time.hour() << ':' << setw(2) << l.time.min() << ':' << setw(2)
    << l.time.sec() << "." << setw(6) << l.time.usec() << ' ' << setfill(' ')
    << setw(5) << l.thread_id << setfill('0') << ' ' << l.filename << ':'
    << l.line_number << "]";
}